

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O2

void recompute_ideal_colors_2planes
               (image_block *blk,block_size_descriptor *bsd,decimation_info *di,
               uint8_t *dec_weights_uquant_plane1,uint8_t *dec_weights_uquant_plane2,endpoints *ep,
               vfloat4 *rgbs_vector,vfloat4 *rgbo_vector,int plane2_component)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  float *pfVar11;
  uint i_1;
  float *pfVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar41;
  float fVar49;
  float fVar50;
  float fVar52;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar66;
  undefined1 auVar62 [16];
  float fVar65;
  float fVar67;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar81;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar83 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vfloat4 vVar91;
  vfloat4 weight_weight_sum;
  vfloat4 rgbq_sum;
  float dec_weight_plane2 [32];
  float dec_weight_plane1 [32];
  float undec_weight_plane2 [216];
  float undec_weight_plane1 [216];
  float local_8e8;
  undefined1 local_8e0 [16];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  float local_820 [32];
  float local_7a0 [32];
  float local_720 [216];
  float local_3c0 [228];
  
  uVar9 = (ulong)blk->texel_count;
  if (uVar9 == 0) {
    __assert_fail("total_texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x567,
                  "void recompute_ideal_colors_2planes(const image_block &, const block_size_descriptor &, const decimation_info &, const uint8_t *, const uint8_t *, endpoints &, vfloat4 &, vfloat4 &, int)"
                 );
  }
  bVar1 = di->weight_count;
  if ((ulong)bVar1 == 0) {
    __assert_fail("weight_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x568,
                  "void recompute_ideal_colors_2planes(const image_block &, const block_size_descriptor &, const decimation_info &, const uint8_t *, const uint8_t *, endpoints &, vfloat4 &, vfloat4 &, int)"
                 );
  }
  if (0x20 < bVar1) {
    __assert_fail("weight_count <= BLOCK_MAX_WEIGHTS_2PLANE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x56d,
                  "void recompute_ideal_colors_2planes(const image_block &, const block_size_descriptor &, const decimation_info &, const uint8_t *, const uint8_t *, endpoints &, vfloat4 &, vfloat4 &, int)"
                 );
  }
  auVar21 = ZEXT3264(CONCAT428(0x3c800000,
                               CONCAT424(0x3c800000,
                                         CONCAT420(0x3c800000,
                                                   CONCAT416(0x3c800000,
                                                             CONCAT412(0x3c800000,
                                                                       CONCAT48(0x3c800000,
                                                                                0x3c8000003c800000))
                                                            )))));
  for (uVar10 = 0; uVar10 < bVar1; uVar10 = uVar10 + 8) {
    auVar90._8_8_ = 0;
    auVar90._0_8_ = *(ulong *)(dec_weights_uquant_plane1 + uVar10);
    auVar4 = vpmovzxbd_avx2(auVar90);
    auVar4 = vcvtdq2ps_avx(auVar4);
    local_7a0[uVar10] = auVar4._0_4_ * 0.015625;
    local_7a0[uVar10 + 1] = auVar4._4_4_ * 0.015625;
    local_7a0[uVar10 + 2] = auVar4._8_4_ * 0.015625;
    local_7a0[uVar10 + 3] = auVar4._12_4_ * 0.015625;
    local_7a0[uVar10 + 4] = auVar4._16_4_ * 0.015625;
    local_7a0[uVar10 + 5] = auVar4._20_4_ * 0.015625;
    local_7a0[uVar10 + 6] = auVar4._24_4_ * 0.015625;
    local_7a0[uVar10 + 7] = auVar4._28_4_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = *(ulong *)(dec_weights_uquant_plane2 + uVar10);
    auVar4 = vpmovzxbd_avx2(auVar47);
    auVar4 = vcvtdq2ps_avx(auVar4);
    auVar5._4_4_ = auVar4._4_4_ * 0.015625;
    auVar5._0_4_ = auVar4._0_4_ * 0.015625;
    auVar5._8_4_ = auVar4._8_4_ * 0.015625;
    auVar5._12_4_ = auVar4._12_4_ * 0.015625;
    auVar5._16_4_ = auVar4._16_4_ * 0.015625;
    auVar5._20_4_ = auVar4._20_4_ * 0.015625;
    auVar5._24_4_ = auVar4._24_4_ * 0.015625;
    auVar5._28_4_ = auVar4._28_4_;
    *(undefined1 (*) [32])(local_820 + uVar10) = auVar5;
  }
  if (di->max_texel_weight_count == 1) {
    pfVar11 = local_7a0;
    pfVar12 = local_820;
  }
  else {
    uVar10 = 0;
    pfVar11 = local_3c0;
    pfVar12 = local_720;
    if (di->max_texel_weight_count < 3) {
      for (; uVar10 < uVar9; uVar10 = uVar10 + 8) {
        bilinear_infill_vla_2(di,local_7a0,(uint)uVar10);
        *(undefined1 (*) [32])(local_3c0 + uVar10) = auVar21._0_32_;
        bilinear_infill_vla_2(di,local_820,(uint)uVar10);
        *(undefined1 (*) [32])(local_720 + uVar10) = auVar21._0_32_;
      }
    }
    else {
      for (; uVar10 < uVar9; uVar10 = uVar10 + 8) {
        bilinear_infill_vla(di,local_7a0,(uint)uVar10);
        *(undefined1 (*) [32])(local_3c0 + uVar10) = auVar21._0_32_;
        bilinear_infill_vla(di,local_820,(uint)uVar10);
        *(undefined1 (*) [32])(local_720 + uVar10) = auVar21._0_32_;
      }
    }
  }
  fVar13 = (float)bsd->texel_count;
  auVar90 = *(undefined1 (*) [16])(blk->channel_weight).m;
  fVar41 = auVar90._0_4_;
  fVar49 = auVar90._4_4_;
  fVar50 = auVar90._8_4_;
  fVar52 = auVar90._12_4_;
  auVar70 = ZEXT816(0) << 0x40;
  auVar47 = vblendps_avx(auVar70,*(undefined1 (*) [16])(blk->data_mean).m,7);
  auVar23._0_4_ = auVar47._0_4_ * auVar47._0_4_;
  auVar23._4_4_ = auVar47._4_4_ * auVar47._4_4_;
  auVar23._8_4_ = auVar47._8_4_ * auVar47._8_4_;
  auVar23._12_4_ = auVar47._12_4_ * auVar47._12_4_;
  auVar48 = vshufpd_avx(auVar23,auVar23,1);
  auVar24._0_4_ = auVar23._0_4_ + auVar48._0_4_;
  auVar24._4_4_ = auVar23._4_4_ + auVar48._4_4_;
  auVar24._8_4_ = auVar23._8_4_ + auVar48._8_4_;
  auVar24._12_4_ = auVar23._12_4_ + auVar48._12_4_;
  auVar48 = vhaddps_avx(auVar24,auVar24);
  auVar48._4_4_ = auVar48._0_4_;
  auVar48._8_4_ = auVar48._0_4_;
  auVar48._12_4_ = auVar48._0_4_;
  auVar48 = vsqrtps_avx(auVar48);
  auVar47 = vdivps_avx(auVar47,auVar48);
  auVar90 = vhaddps_avx(auVar90,auVar90);
  fVar14 = (blk->channel_weight).m[2] + auVar90._0_4_;
  auVar21 = ZEXT464(0x501502f9);
  fVar32 = 0.0;
  fVar78 = 1e-17;
  fVar81 = 1e-17;
  uVar9 = 0;
  fVar82 = 0.0;
  fVar84 = 0.0;
  fVar85 = 0.0;
  fVar86 = 0.0;
  fVar72 = 0.0;
  fVar75 = 0.0;
  fVar76 = 0.0;
  fVar77 = 0.0;
  local_8e0 = ZEXT416(0) << 0x20;
  auVar48 = ZEXT416(0) << 0x20;
  local_8e8 = 1.0;
  auVar90 = ZEXT816(0) << 0x40;
  auVar23 = SUB6416(ZEXT464(0x3f800000),0);
  local_8c0 = auVar48;
  local_880 = local_8e0;
  local_870 = local_8e0;
  local_860 = local_8e0;
  local_850 = local_8e0;
  while( true ) {
    fVar68 = in_ZMM6._0_4_;
    fStack_89c = auVar47._4_4_;
    fStack_898 = auVar47._8_4_;
    fStack_894 = auVar47._12_4_;
    fVar51 = auVar70._0_4_;
    local_8a0 = auVar47._0_4_;
    if (bsd->texel_count == uVar9) break;
    auVar24 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar9]),ZEXT416((uint)blk->data_g[uVar9]),0x10
                           );
    auVar2 = vinsertps_avx(auVar24,ZEXT416((uint)blk->data_b[uVar9]),0x20);
    auVar62._0_4_ = auVar2._0_4_ * local_8a0;
    auVar62._4_4_ = auVar2._4_4_ * fStack_89c;
    auVar62._8_4_ = auVar2._8_4_ * fStack_898;
    auVar62._12_4_ = auVar2._12_4_ * fStack_894;
    auVar24 = vhaddps_avx(auVar62,auVar62);
    fVar68 = pfVar11[uVar9];
    auVar53._4_4_ = fVar68;
    auVar53._0_4_ = fVar68;
    auVar53._8_4_ = fVar68;
    auVar53._12_4_ = fVar68;
    fVar39 = 1.0 - fVar68;
    auVar3 = vshufpd_avx(auVar62,auVar62,1);
    fVar38 = auVar24._0_4_ + auVar3._0_4_;
    in_ZMM6 = ZEXT1664(auVar48);
    local_880 = ZEXT416((uint)(fVar39 * fVar39 + (float)local_880._0_4_));
    local_870 = ZEXT416((uint)(fVar68 * fVar39 + (float)local_870._0_4_));
    local_8e0 = ZEXT416((uint)(fVar68 * fVar68 + (float)local_8e0._0_4_));
    fVar68 = pfVar12[uVar9];
    auVar73._4_4_ = fVar68;
    auVar73._0_4_ = fVar68;
    auVar73._8_4_ = fVar68;
    auVar73._12_4_ = fVar68;
    fVar40 = 1.0 - fVar68;
    local_860 = ZEXT416((uint)((float)local_860._0_4_ + fVar40 * fVar40));
    local_850 = ZEXT416((uint)((float)local_850._0_4_ + fVar68 * fVar40));
    auVar24 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar7._4_4_ = plane2_component;
    auVar7._0_4_ = plane2_component;
    auVar7._8_4_ = plane2_component;
    auVar7._12_4_ = plane2_component;
    auVar3 = vpcmpeqd_avx(auVar24,auVar7);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)blk->data_a[uVar9]),0x30);
    auVar24 = vminss_avx(auVar73,ZEXT416((uint)local_8e8));
    local_8e8 = auVar24._0_4_;
    local_8c0 = vmaxss_avx(auVar73,local_8c0);
    auVar24 = vblendvps_avx(auVar53,auVar73,auVar3);
    fVar32 = fVar32 + fVar68 * fVar68;
    auVar74._0_4_ = auVar24._0_4_ * auVar2._0_4_;
    auVar74._4_4_ = auVar24._4_4_ * auVar2._4_4_;
    auVar74._8_4_ = auVar24._8_4_ * auVar2._8_4_;
    auVar74._12_4_ = auVar24._12_4_ * auVar2._12_4_;
    fVar82 = fVar82 + auVar74._0_4_;
    fVar84 = fVar84 + auVar74._4_4_;
    fVar85 = fVar85 + auVar74._8_4_;
    fVar86 = fVar86 + auVar74._12_4_;
    auVar2 = vsubps_avx(auVar2,auVar74);
    fVar72 = fVar72 + auVar2._0_4_;
    fVar75 = fVar75 + auVar2._4_4_;
    fVar76 = fVar76 + auVar2._8_4_;
    fVar77 = fVar77 + auVar2._12_4_;
    auVar23 = vminss_avx(auVar53,auVar23);
    auVar90 = vmaxss_avx(auVar53,auVar90);
    auVar2 = vinsertps_avx(ZEXT416((uint)fVar39),auVar53,0x1c);
    local_8d0._4_4_ = auVar70._4_4_;
    uStack_8c8._0_4_ = auVar70._8_4_;
    uStack_8c8._4_4_ = auVar70._12_4_;
    auVar70 = vminss_avx(ZEXT416((uint)fVar38),auVar21._0_16_);
    auVar21 = ZEXT1664(auVar70);
    auVar48 = vmaxss_avx(ZEXT416((uint)fVar38),auVar48);
    fVar38 = fVar38 * fVar14;
    auVar70._0_4_ = fVar51 + auVar2._0_4_ * fVar38;
    auVar70._4_4_ = local_8d0._4_4_ + auVar2._4_4_ * fVar38;
    auVar70._8_4_ = (float)uStack_8c8 + auVar2._8_4_ * fVar38;
    auVar70._12_4_ = uStack_8c8._4_4_ + auVar2._12_4_ * fVar38;
    fVar78 = fVar78 + auVar24._0_4_;
    fVar81 = fVar81 + auVar24._4_4_;
    uVar9 = uVar9 + 1;
  }
  auVar47 = vmaxss_avx(auVar48,ZEXT416(0x2edbe6ff));
  auVar54._0_4_ = auVar21._0_4_ / auVar47._0_4_;
  auVar54._4_12_ = auVar21._4_12_;
  auVar24 = vmaxss_avx(auVar54,ZEXT816(0) << 0x40);
  auVar47 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar54,1);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar47 = vblendvps_avx(auVar24,auVar88,auVar47);
  auVar55._8_4_ = 0x233877aa;
  auVar55._0_8_ = 0x233877aa233877aa;
  auVar55._12_4_ = 0x233877aa;
  auVar2._4_4_ = fVar49 * fVar13;
  auVar2._0_4_ = fVar41 * fVar13;
  auVar2._8_4_ = fVar50 * fVar13;
  auVar2._12_4_ = fVar52 * fVar13;
  auVar24 = vmaxps_avx(auVar2,auVar55);
  auVar3._4_4_ = plane2_component;
  auVar3._0_4_ = plane2_component;
  auVar3._8_4_ = plane2_component;
  auVar3._12_4_ = plane2_component;
  auVar2 = vpcmpeqd_avx(auVar3,_DAT_002f8df0);
  fVar13 = auVar48._0_4_;
  auVar56._0_4_ = fVar13 * local_8a0;
  auVar56._4_4_ = fVar13 * fStack_89c;
  auVar56._8_4_ = fVar13 * fStack_898;
  auVar56._12_4_ = fVar13 * fStack_894;
  auVar47 = vinsertps_avx(auVar56,auVar47,0x30);
  *(undefined1 (*) [16])rgbs_vector->m = auVar47;
  fVar13 = fVar41 * (float)local_8e0._0_4_;
  fVar38 = fVar49 * (float)local_8e0._0_4_;
  fVar39 = fVar50 * (float)local_8e0._0_4_;
  fVar40 = fVar52 * (float)local_8e0._0_4_;
  fVar72 = fVar41 * fVar72;
  fVar75 = fVar49 * fVar75;
  fVar76 = fVar50 * fVar76;
  fVar77 = fVar52 * fVar77;
  auVar83._0_4_ = fVar41 * fVar82;
  auVar83._4_4_ = fVar49 * fVar84;
  auVar83._8_4_ = fVar50 * fVar85;
  auVar83._12_4_ = fVar52 * fVar86;
  if (auVar90._0_4_ * 0.999 <= auVar23._0_4_) {
    auVar16._0_4_ = auVar83._0_4_ + fVar72;
    auVar16._4_4_ = auVar83._4_4_ + fVar75;
    auVar16._8_4_ = auVar83._8_4_ + fVar76;
    auVar16._12_4_ = auVar83._12_4_ + fVar77;
    auVar48 = vdivps_avx(auVar16,auVar24);
    auVar90 = vcmpps_avx(auVar48,ZEXT416(0) << 0x20,7);
    auVar23 = vpandn_avx(auVar2,auVar90);
    auVar90 = *(undefined1 (*) [16])ep->endpt1[0].m;
    auVar47 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt0[0].m,auVar48,auVar23);
    auVar48 = vblendvps_avx(auVar90,auVar48,auVar23);
    *(undefined1 (*) [16])ep->endpt0[0].m = auVar47;
    *(undefined1 (*) [16])ep->endpt1[0].m = auVar48;
    auVar47 = vinsertps_avx(auVar56,ZEXT416(0x3f800000),0x30);
  }
  else {
    auVar42._4_4_ = local_870._0_4_;
    auVar42._0_4_ = local_870._0_4_;
    auVar42._8_4_ = local_870._0_4_;
    auVar42._12_4_ = local_870._0_4_;
    auVar57._4_4_ = local_880._0_4_;
    auVar57._0_4_ = local_880._0_4_;
    auVar57._8_4_ = local_880._0_4_;
    auVar57._12_4_ = local_880._0_4_;
    auVar90 = vblendps_avx(auVar57,auVar42,2);
    auVar90 = vinsertps_avx(auVar90,local_8e0,0x20);
    auVar15._0_4_ = fVar14 * auVar90._0_4_;
    auVar15._4_4_ = fVar14 * auVar90._4_4_;
    auVar15._8_4_ = fVar14 * auVar90._8_4_;
    auVar15._12_4_ = fVar14 * auVar90._12_4_;
    fVar14 = fVar41 * (float)local_870._0_4_;
    fVar82 = fVar49 * (float)local_870._0_4_;
    fVar85 = fVar50 * (float)local_870._0_4_;
    fVar86 = fVar52 * (float)local_870._0_4_;
    fVar61 = fVar41 * (float)local_880._0_4_;
    fVar65 = fVar49 * (float)local_880._0_4_;
    fVar66 = fVar50 * (float)local_880._0_4_;
    fVar67 = fVar52 * (float)local_880._0_4_;
    auVar58._0_4_ = fVar13 * fVar61;
    auVar58._4_4_ = fVar38 * fVar65;
    auVar58._8_4_ = fVar39 * fVar66;
    auVar58._12_4_ = fVar40 * fVar67;
    auVar69._0_4_ = fVar14 * fVar14;
    auVar69._4_4_ = fVar82 * fVar82;
    auVar69._8_4_ = fVar85 * fVar85;
    auVar69._12_4_ = fVar86 * fVar86;
    auVar47 = vsubps_avx(auVar58,auVar69);
    auVar90 = vshufpd_avx(auVar15,auVar15,1);
    fVar68 = auVar90._0_4_;
    auVar90 = vmovshdup_avx(auVar15);
    fVar87 = auVar90._0_4_;
    fVar84 = auVar15._0_4_ * fVar68 - fVar87 * fVar87;
    auVar79._0_4_ = fVar72 * fVar13;
    auVar79._4_4_ = fVar75 * fVar38;
    auVar79._8_4_ = fVar76 * fVar39;
    auVar79._12_4_ = fVar77 * fVar40;
    auVar89._0_4_ = auVar83._0_4_ * fVar14;
    auVar89._4_4_ = auVar83._4_4_ * fVar82;
    auVar89._8_4_ = auVar83._8_4_ * fVar85;
    auVar89._12_4_ = auVar83._12_4_ * fVar86;
    auVar48 = vsubps_avx(auVar79,auVar89);
    auVar88._8_4_ = 0x3f800000;
    auVar88._0_8_ = 0x3f8000003f800000;
    auVar88._12_4_ = 0x3f800000;
    auVar63._0_4_ = auVar83._0_4_ * fVar61;
    auVar63._4_4_ = auVar83._4_4_ * fVar65;
    auVar63._8_4_ = auVar83._8_4_ * fVar66;
    auVar63._12_4_ = auVar83._12_4_ * fVar67;
    auVar43._0_4_ = fVar72 * fVar14;
    auVar43._4_4_ = fVar75 * fVar82;
    auVar43._8_4_ = fVar76 * fVar85;
    auVar43._12_4_ = fVar77 * fVar86;
    auVar23 = vsubps_avx(auVar63,auVar43);
    auVar90 = vdivps_avx(auVar88,auVar47);
    auVar80._0_4_ = auVar48._0_4_ * auVar90._0_4_;
    auVar80._4_4_ = auVar48._4_4_ * auVar90._4_4_;
    auVar80._8_4_ = auVar48._8_4_ * auVar90._8_4_;
    auVar80._12_4_ = auVar48._12_4_ * auVar90._12_4_;
    auVar44._0_4_ = auVar23._0_4_ * auVar90._0_4_;
    auVar44._4_4_ = auVar23._4_4_ * auVar90._4_4_;
    auVar44._8_4_ = auVar23._8_4_ * auVar90._8_4_;
    auVar44._12_4_ = auVar23._12_4_ * auVar90._12_4_;
    auVar90 = vsubps_avx(ZEXT816(0) << 0x20,auVar47);
    auVar90 = vmaxps_avx(auVar90,auVar47);
    auVar64._0_4_ = (fVar13 * fVar13 + (fVar14 + fVar14) * fVar14 + fVar61 * fVar61) * 0.0001;
    auVar64._4_4_ = (fVar38 * fVar38 + (fVar82 + fVar82) * fVar82 + fVar65 * fVar65) * 0.0001;
    auVar64._8_4_ = (fVar39 * fVar39 + (fVar85 + fVar85) * fVar85 + fVar66 * fVar66) * 0.0001;
    auVar64._12_4_ = (fVar40 * fVar40 + (fVar86 + fVar86) * fVar86 + fVar67 * fVar67) * 0.0001;
    auVar90 = vcmpps_avx(auVar64,auVar90,1);
    auVar47 = vcmpps_avx(auVar80,auVar44,7);
    auVar90 = vandps_avx(auVar47,auVar90);
    auVar47 = vpandn_avx(auVar2,auVar90);
    auVar90 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt0[0].m,auVar80,auVar47);
    auVar47 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt1[0].m,auVar44,auVar47);
    auVar48 = vmovshdup_avx(auVar70);
    fVar82 = 1.0 / fVar84;
    fVar14 = fVar82 * (fVar51 * fVar68 - fVar87 * auVar48._0_4_);
    fVar82 = fVar82 * (auVar48._0_4_ * auVar15._0_4_ - fVar87 * fVar51);
    *(undefined1 (*) [16])ep->endpt0[0].m = auVar90;
    *(undefined1 (*) [16])ep->endpt1[0].m = auVar47;
    if (((fVar82 <= fVar14) || (NAN(fVar82) || NAN(fVar14))) ||
       (auVar45._8_4_ = 0x7fffffff, auVar45._0_8_ = 0x7fffffff7fffffff, auVar45._12_4_ = 0x7fffffff,
       auVar47 = vandps_avx(ZEXT416((uint)fVar84),auVar45),
       auVar47._0_4_ <=
       (fVar68 * fVar68 + auVar15._0_4_ * auVar15._0_4_ + fVar87 * (fVar87 + fVar87)) * 0.0001))
    goto LAB_0025c59f;
    auVar33._0_4_ = fVar82 * local_8a0;
    auVar33._4_4_ = fVar82 * fStack_89c;
    auVar33._8_4_ = fVar82 * fStack_898;
    auVar33._12_4_ = fVar82 * fStack_894;
    auVar47 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar14 / fVar82)),0x30);
  }
  *(undefined1 (*) [16])rgbs_vector->m = auVar47;
LAB_0025c59f:
  auVar17._0_4_ = fVar41 * fVar32;
  auVar17._4_4_ = fVar49 * fVar32;
  auVar17._8_4_ = fVar50 * fVar32;
  auVar17._12_4_ = fVar52 * fVar32;
  if ((float)local_8c0._0_4_ * 0.999 <= local_8e8) {
    auVar28._0_4_ = auVar83._0_4_ + fVar72;
    auVar28._4_4_ = auVar83._4_4_ + fVar75;
    auVar28._8_4_ = auVar83._8_4_ + fVar76;
    auVar28._12_4_ = auVar83._12_4_ + fVar77;
    auVar27 = vdivps_avx(auVar28,auVar24);
    auVar36._0_12_ = ZEXT812(0);
    auVar36._12_4_ = 0;
    auVar47 = vcmpps_avx(auVar27,auVar36,7);
    auVar35 = auVar27;
  }
  else {
    fVar85 = fVar41 * (float)local_860._0_4_;
    fVar86 = fVar49 * (float)local_860._0_4_;
    fVar51 = fVar50 * (float)local_860._0_4_;
    fVar61 = fVar52 * (float)local_860._0_4_;
    fVar32 = fVar41 * (float)local_850._0_4_;
    fVar14 = fVar49 * (float)local_850._0_4_;
    fVar82 = fVar50 * (float)local_850._0_4_;
    fVar84 = fVar52 * (float)local_850._0_4_;
    auVar25._0_4_ = auVar17._0_4_ * fVar85;
    auVar25._4_4_ = auVar17._4_4_ * fVar86;
    auVar25._8_4_ = auVar17._8_4_ * fVar51;
    auVar25._12_4_ = auVar17._12_4_ * fVar61;
    auVar59._0_4_ = fVar32 * fVar32;
    auVar59._4_4_ = fVar14 * fVar14;
    auVar59._8_4_ = fVar82 * fVar82;
    auVar59._12_4_ = fVar84 * fVar84;
    auVar47 = vsubps_avx(auVar25,auVar59);
    auVar90 = vdivps_avx(auVar88,auVar47);
    fVar68 = auVar17._0_4_ * auVar17._0_4_ + fVar85 * fVar85 + fVar32 * (fVar32 + fVar32);
    auVar26._0_4_ = fVar72 * auVar17._0_4_;
    auVar26._4_4_ = fVar75 * auVar17._4_4_;
    auVar26._8_4_ = fVar76 * auVar17._8_4_;
    auVar26._12_4_ = fVar77 * auVar17._12_4_;
    auVar71._0_4_ = auVar83._0_4_ * fVar32;
    auVar71._4_4_ = auVar83._4_4_ * fVar14;
    auVar71._8_4_ = auVar83._8_4_ * fVar82;
    auVar71._12_4_ = auVar83._12_4_ * fVar84;
    auVar48 = vsubps_avx(auVar26,auVar71);
    auVar27._0_4_ = auVar48._0_4_ * auVar90._0_4_;
    auVar27._4_4_ = auVar48._4_4_ * auVar90._4_4_;
    auVar27._8_4_ = auVar48._8_4_ * auVar90._8_4_;
    auVar27._12_4_ = auVar48._12_4_ * auVar90._12_4_;
    auVar46._0_4_ = auVar83._0_4_ * fVar85;
    auVar46._4_4_ = auVar83._4_4_ * fVar86;
    auVar46._8_4_ = auVar83._8_4_ * fVar51;
    auVar46._12_4_ = auVar83._12_4_ * fVar61;
    auVar34._0_4_ = fVar72 * fVar32;
    auVar34._4_4_ = fVar75 * fVar14;
    auVar34._8_4_ = fVar76 * fVar82;
    auVar34._12_4_ = fVar77 * fVar84;
    auVar48 = vsubps_avx(auVar46,auVar34);
    auVar35._0_4_ = auVar48._0_4_ * auVar90._0_4_;
    auVar35._4_4_ = auVar48._4_4_ * auVar90._4_4_;
    auVar35._8_4_ = auVar48._8_4_ * auVar90._8_4_;
    auVar35._12_4_ = auVar48._12_4_ * auVar90._12_4_;
    auVar48 = vsubps_avx(ZEXT416(0) << 0x20,auVar47);
    auVar47 = vmaxps_avx(auVar48,auVar47);
    auVar60._0_4_ = fVar68 * 0.0001;
    auVar60._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ + fVar86 * fVar86 + fVar14 * (fVar14 + fVar14)) * 0.0001;
    auVar60._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ + fVar51 * fVar51 + fVar82 * (fVar82 + fVar82)) * 0.0001;
    auVar60._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ + fVar61 * fVar61 + fVar84 * (fVar84 + fVar84)) * 0.0001;
    auVar47 = vcmpps_avx(auVar60,auVar47,1);
    auVar48 = vcmpps_avx(auVar27,auVar35,7);
    auVar47 = vandps_avx(auVar48,auVar47);
  }
  auVar47 = vandps_avx(auVar2,auVar47);
  auVar48 = vpslld_avx(auVar47,0x1f);
  auVar47 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt0[0].m,auVar27,auVar48);
  *(undefined1 (*) [16])ep->endpt0[0].m = auVar47;
  auVar47 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt1[0].m,auVar35,auVar48);
  *(undefined1 (*) [16])ep->endpt1[0].m = auVar47;
  if (blk->alpha_lns[0] != '\0' || blk->rgb_lns[0] != '\0') {
    auVar8._4_4_ = plane2_component;
    auVar8._0_4_ = plane2_component;
    auVar8._8_4_ = plane2_component;
    auVar8._12_4_ = plane2_component;
    auVar47 = vpcmpeqd_avx(auVar8,_DAT_0031af30);
    vVar91.m[2] = fVar41 * fVar78;
    vVar91.m[3] = fVar49 * fVar81;
    auVar6._4_4_ = fVar38;
    auVar6._0_4_ = fVar13;
    auVar6._8_4_ = fVar39;
    auVar6._12_4_ = fVar40;
    auVar47 = vblendvps_avx(auVar6,auVar17,auVar47);
    auVar18._0_4_ = fVar41 * auVar47._0_4_;
    auVar18._4_4_ = fVar49 * auVar47._4_4_;
    auVar18._8_4_ = fVar50 * auVar47._8_4_;
    auVar18._12_4_ = fVar52 * auVar47._12_4_;
    auVar47 = vhaddps_avx(auVar18,auVar18);
    auVar23 = vshufpd_avx(auVar18,auVar18,1);
    auVar48 = vhaddps_avx(auVar83,auVar83);
    auVar37._0_4_ = auVar83._0_4_ + fVar72;
    auVar37._4_4_ = auVar83._4_4_ + fVar75;
    auVar37._8_4_ = auVar83._8_4_ + fVar76;
    auVar37._12_4_ = auVar83._12_4_ + fVar77;
    auVar70 = vshufpd_avx(auVar83,auVar83,1);
    auVar19._0_4_ = auVar70._0_4_ + auVar48._0_4_;
    auVar19._4_4_ = auVar70._4_4_ + auVar48._4_4_;
    auVar19._8_4_ = auVar70._8_4_ + auVar48._8_4_;
    auVar19._12_4_ = auVar70._12_4_ + auVar48._12_4_;
    auVar48 = vinsertps_avx(auVar37,auVar19,0x30);
    local_8d0 = auVar24._0_8_;
    uStack_8c8 = auVar24._8_8_;
    vVar91.m[0] = (float)(undefined4)local_8d0;
    vVar91.m[1] = local_8d0._4_4_;
    auVar22 = ZEXT856(uStack_8c8);
    weight_weight_sum.m._0_8_ = auVar48._0_8_;
    weight_weight_sum.m[2] = auVar23._0_4_ + auVar47._0_4_;
    weight_weight_sum.m[3] = 0.0;
    rgbq_sum.m._0_8_ = auVar70._0_8_;
    rgbq_sum.m._8_8_ = auVar90._0_8_;
    vVar91 = compute_rgbo_vector(vVar91,weight_weight_sum,rgbq_sum,fVar68);
    auVar21._0_8_ = vVar91.m._0_8_;
    auVar21._8_56_ = auVar22;
    auVar29._0_4_ = vVar91.m[0] * vVar91.m[0];
    auVar29._4_4_ = vVar91.m[1] * vVar91.m[1];
    auVar29._8_4_ = auVar22._0_4_ * auVar22._0_4_;
    auVar29._12_4_ = auVar22._4_4_ * auVar22._4_4_;
    auVar90 = vshufpd_avx(auVar29,auVar29,1);
    auVar30._0_4_ = auVar29._0_4_ + auVar90._0_4_;
    auVar30._4_4_ = auVar29._4_4_ + auVar90._4_4_;
    auVar30._8_4_ = auVar29._8_4_ + auVar90._8_4_;
    auVar30._12_4_ = auVar29._12_4_ + auVar90._12_4_;
    auVar90 = vhaddps_avx(auVar30,auVar30);
    *(undefined1 (*) [16])rgbo_vector->m = auVar21._0_16_;
    if (NAN(auVar90._0_4_)) {
      auVar90 = *(undefined1 (*) [16])ep->endpt0[0].m;
      auVar47 = *(undefined1 (*) [16])ep->endpt1[0].m;
      auVar23 = vsubps_avx(auVar47,auVar90);
      auVar48 = vhaddps_avx(auVar23,auVar23);
      auVar23 = vshufpd_avx(auVar23,auVar23,1);
      auVar48 = vmaxss_avx(ZEXT416((uint)((auVar23._0_4_ + auVar48._0_4_) * 0.33333334)),
                           ZEXT816(0) << 0x20);
      auVar20._0_4_ = (auVar90._0_4_ + auVar47._0_4_) * 0.5;
      auVar20._4_4_ = (auVar90._4_4_ + auVar47._4_4_) * 0.5;
      auVar20._8_4_ = (auVar90._8_4_ + auVar47._8_4_) * 0.5;
      auVar20._12_4_ = (auVar90._12_4_ + auVar47._12_4_) * 0.5;
      fVar32 = auVar48._0_4_ * 0.5;
      auVar31._4_4_ = fVar32;
      auVar31._0_4_ = fVar32;
      auVar31._8_4_ = fVar32;
      auVar31._12_4_ = fVar32;
      auVar90 = vsubps_avx(auVar20,auVar31);
      auVar90 = vinsertps_avx(auVar90,auVar48,0x30);
      *(undefined1 (*) [16])rgbo_vector->m = auVar90;
    }
  }
  return;
}

Assistant:

void recompute_ideal_colors_2planes(
	const image_block& blk,
	const block_size_descriptor& bsd,
	const decimation_info& di,
	const uint8_t* dec_weights_uquant_plane1,
	const uint8_t* dec_weights_uquant_plane2,
	endpoints& ep,
	vfloat4& rgbs_vector,
	vfloat4& rgbo_vector,
	int plane2_component
) {
	unsigned int weight_count = di.weight_count;
	unsigned int total_texel_count = blk.texel_count;

	promise(total_texel_count > 0);
	promise(weight_count > 0);

	ASTCENC_ALIGNAS float dec_weight_plane1[BLOCK_MAX_WEIGHTS_2PLANE];
	ASTCENC_ALIGNAS float dec_weight_plane2[BLOCK_MAX_WEIGHTS_2PLANE];

	assert(weight_count <= BLOCK_MAX_WEIGHTS_2PLANE);

	for (unsigned int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
	{
		vint unquant_value1(dec_weights_uquant_plane1 + i);
		vfloat unquant_value1f = int_to_float(unquant_value1) * vfloat(1.0f / 64.0f);
		storea(unquant_value1f, dec_weight_plane1 + i);

		vint unquant_value2(dec_weights_uquant_plane2 + i);
		vfloat unquant_value2f = int_to_float(unquant_value2) * vfloat(1.0f / 64.0f);
		storea(unquant_value2f, dec_weight_plane2 + i);
	}

	ASTCENC_ALIGNAS float undec_weight_plane1[BLOCK_MAX_TEXELS];
	ASTCENC_ALIGNAS float undec_weight_plane2[BLOCK_MAX_TEXELS];

	float* undec_weight_plane1_ref;
	float* undec_weight_plane2_ref;

	if (di.max_texel_weight_count == 1)
	{
		undec_weight_plane1_ref = dec_weight_plane1;
		undec_weight_plane2_ref = dec_weight_plane2;
	}
	else if (di.max_texel_weight_count <= 2)
	{
		for (unsigned int i = 0; i < total_texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat weight = bilinear_infill_vla_2(di, dec_weight_plane1, i);
			storea(weight, undec_weight_plane1 + i);

			weight = bilinear_infill_vla_2(di, dec_weight_plane2, i);
			storea(weight, undec_weight_plane2 + i);
		}

		undec_weight_plane1_ref = undec_weight_plane1;
		undec_weight_plane2_ref = undec_weight_plane2;
	}
	else
	{
		for (unsigned int i = 0; i < total_texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat weight = bilinear_infill_vla(di, dec_weight_plane1, i);
			storea(weight, undec_weight_plane1 + i);

			weight = bilinear_infill_vla(di, dec_weight_plane2, i);
			storea(weight, undec_weight_plane2 + i);
		}

		undec_weight_plane1_ref = undec_weight_plane1;
		undec_weight_plane2_ref = undec_weight_plane2;
	}

	unsigned int texel_count = bsd.texel_count;
	vfloat4 rgba_weight_sum = max(blk.channel_weight * static_cast<float>(texel_count), 1e-17f);
	vfloat4 scale_dir = normalize(blk.data_mean.swz<0, 1, 2>());

	float scale_max = 0.0f;
	float scale_min = 1e10f;

	float wmin1 = 1.0f;
	float wmax1 = 0.0f;

	float wmin2 = 1.0f;
	float wmax2 = 0.0f;

	float left1_sum_s = 0.0f;
	float middle1_sum_s = 0.0f;
	float right1_sum_s = 0.0f;

	float left2_sum_s = 0.0f;
	float middle2_sum_s = 0.0f;
	float right2_sum_s = 0.0f;

	vfloat4 color_vec_x = vfloat4::zero();
	vfloat4 color_vec_y = vfloat4::zero();

	vfloat4 scale_vec = vfloat4::zero();

	vfloat4 weight_weight_sum = vfloat4(1e-17f);

	vmask4 p2_mask = vint4::lane_id() == vint4(plane2_component);
	vfloat4 color_weight = blk.channel_weight;
	float ls_weight = hadd_rgb_s(color_weight);

	for (unsigned int j = 0; j < texel_count; j++)
	{
		vfloat4 rgba = blk.texel(j);

		float idx0 = undec_weight_plane1_ref[j];

		float om_idx0 = 1.0f - idx0;
		wmin1 = astc::min(idx0, wmin1);
		wmax1 = astc::max(idx0, wmax1);

		float scale = dot3_s(scale_dir, rgba);
		scale_min = astc::min(scale, scale_min);
		scale_max = astc::max(scale, scale_max);

		left1_sum_s   += om_idx0 * om_idx0;
		middle1_sum_s += om_idx0 * idx0;
		right1_sum_s  += idx0 * idx0;

		float idx1 = undec_weight_plane2_ref[j];

		float om_idx1 = 1.0f - idx1;
		wmin2 = astc::min(idx1, wmin2);
		wmax2 = astc::max(idx1, wmax2);

		left2_sum_s   += om_idx1 * om_idx1;
		middle2_sum_s += om_idx1 * idx1;
		right2_sum_s  += idx1 * idx1;

		vfloat4 color_idx = select(vfloat4(idx0), vfloat4(idx1), p2_mask);

		vfloat4 cwprod = rgba;
		vfloat4 cwiprod = cwprod * color_idx;

		color_vec_y += cwiprod;
		color_vec_x += cwprod - cwiprod;

		scale_vec += vfloat2(om_idx0, idx0) * (ls_weight * scale);
		weight_weight_sum += color_idx;
	}

	vfloat4 left1_sum   = vfloat4(left1_sum_s) * color_weight;
	vfloat4 middle1_sum = vfloat4(middle1_sum_s) * color_weight;
	vfloat4 right1_sum  = vfloat4(right1_sum_s) * color_weight;
	vfloat4 lmrs_sum    = vfloat3(left1_sum_s, middle1_sum_s, right1_sum_s) * ls_weight;

	vfloat4 left2_sum   = vfloat4(left2_sum_s) * color_weight;
	vfloat4 middle2_sum = vfloat4(middle2_sum_s) * color_weight;
	vfloat4 right2_sum  = vfloat4(right2_sum_s) * color_weight;

	color_vec_x = color_vec_x * color_weight;
	color_vec_y = color_vec_y * color_weight;

	// Initialize the luminance and scale vectors with a reasonable default
	float scalediv = scale_min / astc::max(scale_max, 1e-10f);
	scalediv = astc::clamp1f(scalediv);

	vfloat4 sds = scale_dir * scale_max;

	rgbs_vector = vfloat4(sds.lane<0>(), sds.lane<1>(), sds.lane<2>(), scalediv);

	if (wmin1 >= wmax1 * 0.999f)
	{
		// If all weights in the partition were equal, then just take average of all colors in
		// the partition and use that as both endpoint colors
		vfloat4 avg = (color_vec_x + color_vec_y) / rgba_weight_sum;

		vmask4 p1_mask = vint4::lane_id() != vint4(plane2_component);
		vmask4 notnan_mask = avg == avg;
		vmask4 full_mask = p1_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], avg, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], avg, full_mask);

		rgbs_vector = vfloat4(sds.lane<0>(), sds.lane<1>(), sds.lane<2>(), 1.0f);
	}
	else
	{
		// Otherwise, complete the analytic calculation of ideal-endpoint-values for the given
		// set of texel weights and pixel colors
		vfloat4 color_det1 = (left1_sum * right1_sum) - (middle1_sum * middle1_sum);
		vfloat4 color_rdet1 = 1.0f / color_det1;

		float ls_det1  = (lmrs_sum.lane<0>() * lmrs_sum.lane<2>()) - (lmrs_sum.lane<1>() * lmrs_sum.lane<1>());
		float ls_rdet1 = 1.0f / ls_det1;

		vfloat4 color_mss1 = (left1_sum * left1_sum)
		                   + (2.0f * middle1_sum * middle1_sum)
		                   + (right1_sum * right1_sum);

		float ls_mss1 = (lmrs_sum.lane<0>() * lmrs_sum.lane<0>())
		              + (2.0f * lmrs_sum.lane<1>() * lmrs_sum.lane<1>())
		              + (lmrs_sum.lane<2>() * lmrs_sum.lane<2>());

		vfloat4 ep0 = (right1_sum * color_vec_x - middle1_sum * color_vec_y) * color_rdet1;
		vfloat4 ep1 = (left1_sum * color_vec_y - middle1_sum * color_vec_x) * color_rdet1;

		float scale_ep0 = (lmrs_sum.lane<2>() * scale_vec.lane<0>() - lmrs_sum.lane<1>() * scale_vec.lane<1>()) * ls_rdet1;
		float scale_ep1 = (lmrs_sum.lane<0>() * scale_vec.lane<1>() - lmrs_sum.lane<1>() * scale_vec.lane<0>()) * ls_rdet1;

		vmask4 p1_mask = vint4::lane_id() != vint4(plane2_component);
		vmask4 det_mask = abs(color_det1) > (color_mss1 * 1e-4f);
		vmask4 notnan_mask = (ep0 == ep0) & (ep1 == ep1);
		vmask4 full_mask = p1_mask & det_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], ep0, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], ep1, full_mask);

		if (fabsf(ls_det1) > (ls_mss1 * 1e-4f) && scale_ep0 == scale_ep0 && scale_ep1 == scale_ep1 && scale_ep0 < scale_ep1)
		{
			float scalediv2 = scale_ep0 / scale_ep1;
			vfloat4 sdsm = scale_dir * scale_ep1;
			rgbs_vector = vfloat4(sdsm.lane<0>(), sdsm.lane<1>(), sdsm.lane<2>(), scalediv2);
		}
	}

	if (wmin2 >= wmax2 * 0.999f)
	{
		// If all weights in the partition were equal, then just take average of all colors in
		// the partition and use that as both endpoint colors
		vfloat4 avg = (color_vec_x + color_vec_y) / rgba_weight_sum;

		vmask4 notnan_mask = avg == avg;
		vmask4 full_mask = p2_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], avg, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], avg, full_mask);
	}
	else
	{
		// Otherwise, complete the analytic calculation of ideal-endpoint-values for the given
		// set of texel weights and pixel colors
		vfloat4 color_det2 = (left2_sum * right2_sum) - (middle2_sum * middle2_sum);
		vfloat4 color_rdet2 = 1.0f / color_det2;

		vfloat4 color_mss2 = (left2_sum * left2_sum)
		                   + (2.0f * middle2_sum * middle2_sum)
		                   + (right2_sum * right2_sum);

		vfloat4 ep0 = (right2_sum * color_vec_x - middle2_sum * color_vec_y) * color_rdet2;
		vfloat4 ep1 = (left2_sum * color_vec_y - middle2_sum * color_vec_x) * color_rdet2;

		vmask4 det_mask = abs(color_det2) > (color_mss2 * 1e-4f);
		vmask4 notnan_mask = (ep0 == ep0) & (ep1 == ep1);
		vmask4 full_mask = p2_mask & det_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], ep0, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], ep1, full_mask);
	}

	// Calculations specific to mode #7, the HDR RGB-scale mode - skip if known LDR
	if (blk.rgb_lns[0] || blk.alpha_lns[0])
	{
		weight_weight_sum = weight_weight_sum * color_weight;
		float psum = dot3_s(select(right1_sum, right2_sum, p2_mask), color_weight);

		vfloat4 rgbq_sum = color_vec_x + color_vec_y;
		rgbq_sum.set_lane<3>(hadd_rgb_s(color_vec_y));

		rgbo_vector = compute_rgbo_vector(rgba_weight_sum, weight_weight_sum, rgbq_sum, psum);

		// We can get a failure due to the use of a singular (non-invertible) matrix
		// If it failed, compute rgbo_vectors[] with a different method ...
		if (astc::isnan(dot_s(rgbo_vector, rgbo_vector)))
		{
			vfloat4 v0 = ep.endpt0[0];
			vfloat4 v1 = ep.endpt1[0];

			float avgdif = hadd_rgb_s(v1 - v0) * (1.0f / 3.0f);
			avgdif = astc::max(avgdif, 0.0f);

			vfloat4 avg = (v0 + v1) * 0.5f;
			vfloat4 ep0 = avg - vfloat4(avgdif) * 0.5f;

			rgbo_vector = vfloat4(ep0.lane<0>(), ep0.lane<1>(), ep0.lane<2>(), avgdif);
		}
	}
}